

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall kj::Vector<kj::StringPtr>::setCapacity(Vector<kj::StringPtr> *this,size_t newSize)

{
  StringPtr *pSVar1;
  StringPtr *__dest;
  size_t __n;
  ArrayBuilder<kj::StringPtr> local_38;
  
  pSVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pSVar1 >> 4)) {
    (this->builder).pos = pSVar1 + newSize;
  }
  __dest = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringPtr>(newSize);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pSVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pSVar1;
  local_38.ptr = __dest;
  if (__n != 0) {
    memcpy(__dest,pSVar1,__n);
  }
  local_38.pos = (RemoveConst<kj::StringPtr> *)((long)__dest + __n);
  ArrayBuilder<kj::StringPtr>::operator=(&this->builder,&local_38);
  ArrayBuilder<kj::StringPtr>::dispose(&local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }